

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

bool waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<QString>>
               (QPromise<QString> *promise)

{
  QPromiseBase<QString> local_38;
  QPromiseBase<QString> local_28;
  byte local_11;
  QPromise<QString> *pQStack_10;
  bool result;
  QPromise<QString> *promise_local;
  
  local_11 = 0;
  pQStack_10 = promise;
  QtPromise::QPromiseBase<QString>::
  tapFail<waitForRejected<QtPromise::QPromiseConversionException,QtPromise::QPromise<QString>>(QtPromise::QPromise<QString>const&)::_lambda(QtPromise::QPromiseConversionException_const&)_1_>
            (&local_38,(anon_class_8_1_6971b95b)promise);
  QtPromise::QPromiseBase<QString>::wait(&local_28,&local_38);
  QtPromise::QPromise<QString>::~QPromise((QPromise<QString> *)&local_28);
  QtPromise::QPromise<QString>::~QPromise((QPromise<QString> *)&local_38);
  return (bool)(local_11 & 1);
}

Assistant:

static inline bool waitForRejected(const T& promise)
{
    bool result = false;
    promise
        .tapFail([&](const E&) {
            result = true;
        })
        .wait();
    return result;
}